

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O0

REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,REF_CLOUD original)

{
  REF_CLOUD pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_GLOB local_48;
  REF_GLOB local_40;
  REF_GLOB local_38;
  REF_GLOB global;
  REF_INT i;
  REF_INT item;
  REF_CLOUD ref_cloud;
  REF_CLOUD original_local;
  REF_CLOUD *ref_cloud_ptr_local;
  
  pRVar1 = (REF_CLOUD)malloc(0x20);
  *ref_cloud_ptr = pRVar1;
  if (*ref_cloud_ptr == (REF_CLOUD)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x3b,
           "ref_cloud_deep_copy","malloc *ref_cloud_ptr of REF_CLOUD_STRUCT NULL");
    ref_cloud_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_cloud_ptr;
    pRVar1->n = original->n;
    pRVar1->max = original->max;
    pRVar1->naux = original->naux;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x43,
             "ref_cloud_deep_copy","malloc ref_cloud->global of REF_GLOB negative");
      ref_cloud_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_GLOB *)malloc((long)pRVar1->max << 3);
      pRVar1->global = pRVar2;
      if (pRVar1->global == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
               0x43,"ref_cloud_deep_copy","malloc ref_cloud->global of REF_GLOB NULL");
        ref_cloud_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->naux * pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
               0x45,"ref_cloud_deep_copy","malloc ref_cloud->aux of REF_DBL negative");
        ref_cloud_ptr_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_DBL *)malloc((long)(pRVar1->naux * pRVar1->max) << 3);
        pRVar1->aux = pRVar3;
        if (pRVar1->aux == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
                 0x45,"ref_cloud_deep_copy","malloc ref_cloud->aux of REF_DBL NULL");
          ref_cloud_ptr_local._4_4_ = 2;
        }
        else {
          global._4_4_ = 0;
          if (original->n < 1) {
            local_40 = -1;
          }
          else {
            local_40 = *original->global;
          }
          local_38 = local_40;
          while (global._4_4_ < original->n) {
            pRVar1->global[global._4_4_] = local_38;
            for (global._0_4_ = 0; (int)global < pRVar1->naux; global._0_4_ = (int)global + 1) {
              pRVar1->aux[(int)global + pRVar1->naux * global._4_4_] =
                   original->aux[(int)global + original->naux * global._4_4_];
            }
            global._4_4_ = global._4_4_ + 1;
            if ((global._4_4_ < 0) || (original->n <= global._4_4_)) {
              local_48 = -1;
            }
            else {
              local_48 = original->global[global._4_4_];
            }
            local_38 = local_48;
          }
          ref_cloud_ptr_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_cloud_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,
                                       REF_CLOUD original) {
  REF_CLOUD ref_cloud;
  REF_INT item, i;
  REF_GLOB global;

  ref_malloc(*ref_cloud_ptr, 1, REF_CLOUD_STRUCT);

  ref_cloud = (*ref_cloud_ptr);

  ref_cloud_n(ref_cloud) = ref_cloud_n(original);
  ref_cloud_max(ref_cloud) = ref_cloud_max(original);
  ref_cloud_naux(ref_cloud) = ref_cloud_naux(original);

  ref_malloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
  ref_malloc(ref_cloud->aux,
             ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);

  each_ref_cloud_global(original, item, global) {
    ref_cloud_global(ref_cloud, item) = global;
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(original, i, item);
    }
  }

  return REF_SUCCESS;
}